

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::code_block(jpeg_encoder *this,int component_num)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  lVar7 = 0xcc;
  do {
    iVar12 = *(int *)(this->m_comp_v_samp + lVar7 + 4) +
             *(int *)(this->m_comp_h_samp + lVar7 + -0x15);
    sVar3 = (short)*(int *)(this->m_comp_h_samp + lVar7 + -0x15) -
            (short)*(int *)(this->m_comp_v_samp + lVar7 + 4);
    iVar9 = *(int *)(this->m_comp_v_samp + lVar7) + *(int *)(this->m_comp_h_samp + lVar7 + -0x11);
    sVar5 = (short)*(int *)(this->m_comp_h_samp + lVar7 + -0x11) -
            (short)*(int *)(this->m_comp_v_samp + lVar7);
    iVar10 = *(int *)(this->m_comp_h_samp + lVar7 + -1) +
             *(int *)(this->m_comp_h_samp + lVar7 + -0xd);
    sVar4 = (short)*(int *)(this->m_comp_h_samp + lVar7 + -0xd) -
            (short)*(int *)(this->m_comp_h_samp + lVar7 + -1);
    iVar11 = *(int *)(this->m_comp_h_samp + lVar7 + -5) + *(int *)(this->m_comp_h_samp + lVar7 + -9)
    ;
    sVar6 = (short)*(int *)(this->m_comp_h_samp + lVar7 + -9) -
            (short)*(int *)(this->m_comp_h_samp + lVar7 + -5);
    iVar8 = iVar12 + iVar11;
    sVar1 = (short)iVar12 - (short)iVar11;
    iVar13 = iVar9 + iVar10;
    sVar2 = (short)iVar9 - (short)iVar10;
    iVar12 = (short)(sVar3 + sVar4 + sVar5 + sVar6) * 0x25a1;
    iVar11 = (short)(sVar5 + sVar6) * -0x3ec5 + iVar12;
    iVar12 = (short)(sVar3 + sVar4) * -0xc7c + iVar12;
    *(int *)(this->m_comp_h_samp + lVar7 + -0x15) = (iVar8 + iVar13) * 4;
    iVar10 = (short)(sVar3 + sVar6) * -0x1ccd;
    *(int *)(this->m_comp_h_samp + lVar7 + -0x11) = iVar10 + sVar3 * 0x300b + 0x400 + iVar12 >> 0xb;
    iVar14 = (short)(sVar1 + sVar2) * 0x1151;
    *(int *)(this->m_comp_h_samp + lVar7 + -0xd) = sVar1 * 0x187e + iVar14 + 0x400 >> 0xb;
    iVar9 = (short)(sVar5 + sVar4) * -0x5203;
    *(int *)(this->m_comp_h_samp + lVar7 + -9) = sVar5 * 0x6254 + iVar9 + 0x400 + iVar11 >> 0xb;
    *(int *)(this->m_comp_h_samp + lVar7 + -5) = (iVar8 - iVar13) * 4;
    *(int *)(this->m_comp_h_samp + lVar7 + -1) = sVar4 * 0x41b3 + iVar9 + 0x400 + iVar12 >> 0xb;
    *(int *)(this->m_comp_v_samp + lVar7) = sVar2 * -0x3b21 + iVar14 + 0x400 >> 0xb;
    *(int *)(this->m_comp_v_samp + lVar7 + 4) = sVar6 * 0x98e + iVar10 + 0x400 + iVar11 >> 0xb;
    lVar7 = lVar7 + 0x20;
  } while ((int)lVar7 != 0x1cc);
  lVar7 = 0x33;
  do {
    iVar11 = *(int *)((long)this->m_mcu_lines + lVar7 * 4 + -8);
    iVar12 = this->m_sample_array[lVar7 + 5] + *(int *)(this->m_comp_h_samp + lVar7 * 4 + -0x15);
    sVar3 = (short)*(int *)(this->m_comp_h_samp + lVar7 * 4 + -0x15) -
            (short)this->m_sample_array[lVar7 + 5];
    iVar9 = this->m_sample_array[lVar7 + -3] + *(int *)(this->m_comp_v_samp + lVar7 * 4 + 8);
    sVar5 = (short)*(int *)(this->m_comp_v_samp + lVar7 * 4 + 8) -
            (short)this->m_sample_array[lVar7 + -3];
    iVar10 = this->m_sample_array[lVar7 + -0xb] + iVar11;
    sVar4 = (short)iVar11 - (short)this->m_sample_array[lVar7 + -0xb];
    iVar11 = this->m_sample_array[lVar7 + -0x13] + this->m_sample_array[lVar7 + -0x1b];
    sVar6 = (short)this->m_sample_array[lVar7 + -0x1b] - (short)this->m_sample_array[lVar7 + -0x13];
    iVar8 = iVar12 + iVar11;
    sVar1 = (short)iVar12 - (short)iVar11;
    iVar11 = iVar9 + iVar10;
    sVar2 = (short)iVar9 - (short)iVar10;
    iVar14 = (short)(sVar3 + sVar4 + sVar5 + sVar6) * 0x25a1;
    iVar12 = (short)(sVar5 + sVar6) * -0x3ec5 + iVar14;
    iVar14 = (short)(sVar3 + sVar4) * -0xc7c + iVar14;
    *(int *)(this->m_comp_h_samp + lVar7 * 4 + -0x15) = iVar11 + iVar8 + 0x10 >> 5;
    iVar10 = (short)(sVar3 + sVar6) * -0x1ccd;
    *(int *)(this->m_comp_v_samp + lVar7 * 4 + 8) =
         iVar10 + sVar3 * 0x300b + 0x20000 + iVar14 >> 0x12;
    iVar13 = (short)(sVar1 + sVar2) * 0x1151;
    *(int *)((long)this->m_mcu_lines + lVar7 * 4 + -8) = sVar1 * 0x187e + iVar13 + 0x20000 >> 0x12;
    iVar9 = (short)(sVar5 + sVar4) * -0x5203;
    this->m_sample_array[lVar7 + -0x1b] = sVar5 * 0x6254 + iVar9 + 0x20000 + iVar12 >> 0x12;
    this->m_sample_array[lVar7 + -0x13] = (iVar8 - iVar11) + 0x10 >> 5;
    this->m_sample_array[lVar7 + -0xb] = sVar4 * 0x41b3 + iVar9 + 0x20000 + iVar14 >> 0x12;
    this->m_sample_array[lVar7 + -3] = sVar2 * -0x3b21 + iVar13 + 0x20000 >> 0x12;
    this->m_sample_array[lVar7 + 5] = sVar6 * 0x98e + iVar10 + 0x20000 + iVar12 >> 0x12;
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 0x3b);
  load_quantized_coefficients(this,component_num);
  if (this->m_pass_num == '\x01') {
    code_coefficients_pass_one(this,component_num);
    return;
  }
  code_coefficients_pass_two(this,component_num);
  return;
}

Assistant:

void jpeg_encoder::code_block(int component_num)
	{
		DCT2D(m_sample_array);
		load_quantized_coefficients(component_num);
		if (m_pass_num == 1)
			code_coefficients_pass_one(component_num);
		else
			code_coefficients_pass_two(component_num);
	}